

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

double ImPlot::PlotHistogram2D<long_long>
                 (char *label_id,longlong *xs,longlong *ys,int count,int x_bins,int y_bins,
                 bool density,ImPlotLimits range,bool outliers)

{
  TransformerLinLin transformer;
  long lVar1;
  double *pdVar2;
  ImPlotPlot *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  double dVar10;
  double dVar11;
  int cols;
  bool bVar12;
  long lVar13;
  double *__dest;
  ImDrawList *DrawList;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ImPlotRange *pIVar17;
  int iVar18;
  ulong in_R11;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  double dVar29;
  int iVar31;
  undefined1 auVar30 [16];
  double dVar32;
  undefined1 auVar33 [16];
  double scale_max;
  int x_bins_local;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double height;
  double width;
  int y_bins_local;
  double *local_60;
  char *local_58;
  ImPlotPoint local_50;
  ImPlotPoint local_40;
  
  if ((y_bins == 0 || x_bins == 0) || count < 1) {
    return 0.0;
  }
  uVar15 = (ulong)(uint)count;
  if ((((range.X.Min == 0.0) && (!NAN(range.X.Min))) && (range.X.Max == 0.0)) && (!NAN(range.X.Max))
     ) {
    lVar13 = *xs;
    lVar14 = lVar13;
    if (1 < (uint)count) {
      uVar16 = 1;
      do {
        lVar1 = xs[uVar16];
        if (lVar1 < lVar14) {
          lVar14 = lVar1;
        }
        if (lVar13 < lVar1) {
          lVar13 = lVar1;
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    range.X.Min = (double)lVar14;
    range.X.Max = (double)lVar13;
  }
  dVar10 = range.X.Max;
  if (((range.Y.Min == 0.0) && (!NAN(range.Y.Min))) && ((range.Y.Max == 0.0 && (!NAN(range.Y.Max))))
     ) {
    lVar13 = *ys;
    lVar14 = lVar13;
    if (1 < count) {
      uVar16 = 1;
      do {
        lVar1 = ys[uVar16];
        if (lVar1 < lVar14) {
          lVar14 = lVar1;
        }
        if (lVar13 < lVar1) {
          lVar13 = lVar1;
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    range.Y.Min = (double)lVar14;
    range.Y.Max = (double)lVar13;
  }
  dVar11 = range.Y.Max;
  uStack_80 = 0;
  uStack_90 = 0;
  x_bins_local = x_bins;
  local_98 = range.Y.Min;
  local_88 = range.X.Min;
  y_bins_local = y_bins;
  local_58 = label_id;
  if (x_bins < 0) {
    CalculateBins<long_long>(xs,count,x_bins,&range.X,&x_bins_local,&width);
  }
  else {
    width = (range.X.Max - range.X.Min) / (double)x_bins;
  }
  if (y_bins < 0) {
    CalculateBins<long_long>(ys,count,y_bins,&range.Y,&y_bins_local,&height);
    y_bins = y_bins_local;
  }
  else {
    height = (dVar11 - local_98) / (double)y_bins;
  }
  cols = x_bins_local;
  pIVar8 = GImPlot;
  uVar19 = y_bins * x_bins_local;
  iVar18 = (GImPlot->Temp1).Capacity;
  if (iVar18 < (int)uVar19) {
    if (iVar18 == 0) {
      uVar20 = 8;
    }
    else {
      uVar20 = iVar18 / 2 + iVar18;
    }
    if ((int)uVar20 <= (int)uVar19) {
      uVar20 = uVar19;
    }
    __dest = (double *)ImGui::MemAlloc((long)(int)uVar20 << 3);
    pdVar2 = (pIVar8->Temp1).Data;
    if (pdVar2 != (double *)0x0) {
      local_60 = __dest;
      memcpy(__dest,pdVar2,(long)(pIVar8->Temp1).Size << 3);
      ImGui::MemFree((pIVar8->Temp1).Data);
      __dest = local_60;
    }
    (pIVar8->Temp1).Data = __dest;
    (pIVar8->Temp1).Capacity = uVar20;
  }
  (pIVar8->Temp1).Size = uVar19;
  if (0 < (int)uVar19) {
    uVar16 = 0;
    do {
      if ((long)(pIVar8->Temp1).Size <= (long)uVar16) goto LAB_0024632b;
      (pIVar8->Temp1).Data[uVar16] = 0.0;
      uVar16 = uVar16 + 1;
    } while (uVar19 != uVar16);
  }
  auVar23._8_8_ = height;
  auVar23._0_8_ = width;
  scale_max = 0.0;
  uVar16 = 0;
  iVar18 = 0;
  do {
    dVar32 = (double)ys[uVar16];
    dVar29 = (double)xs[uVar16];
    if (((local_88 <= dVar29) && (dVar29 <= dVar10)) && ((local_98 <= dVar32 && (dVar32 <= dVar11)))
       ) {
      auVar30._0_8_ = dVar29 - local_88;
      auVar30._8_8_ = dVar32 - local_98;
      auVar30 = divpd(auVar30,auVar23);
      iVar28 = (int)auVar30._0_8_;
      iVar31 = (int)auVar30._8_8_;
      iVar21 = iVar28;
      if (cols + -1 <= iVar28) {
        iVar21 = cols + -1;
      }
      auVar33._4_4_ = iVar28;
      auVar33._0_4_ = iVar28;
      auVar33._8_4_ = iVar31;
      auVar33._12_4_ = iVar31;
      uVar20 = movmskpd((int)in_R11,auVar33);
      iVar28 = 0;
      if ((uVar20 & 1) == 0) {
        iVar28 = iVar21;
      }
      if (y_bins + -1 <= iVar31) {
        iVar31 = y_bins + -1;
      }
      iVar21 = 0;
      if ((uVar20 & 2) == 0) {
        iVar21 = iVar31;
      }
      uVar20 = iVar21 * cols + iVar28;
      if (((int)uVar20 < 0) || ((pIVar8->Temp1).Size <= (int)uVar20)) goto LAB_0024632b;
      pdVar2 = (pIVar8->Temp1).Data;
      in_R11 = (ulong)uVar20;
      dVar29 = pdVar2[in_R11] + 1.0;
      pdVar2[in_R11] = dVar29;
      if ((pIVar8->Temp1).Size <= (int)uVar20) goto LAB_0024632b;
      if (dVar29 <= scale_max) {
        dVar29 = scale_max;
      }
      scale_max = dVar29;
      iVar18 = iVar18 + 1;
    }
    uVar16 = uVar16 + 1;
  } while (uVar15 != uVar16);
  if (density) {
    if (outliers) {
      iVar18 = count;
    }
    dVar29 = 1.0 / ((double)iVar18 * width * height);
    if (0 < (int)uVar19) {
      uVar15 = 0;
      do {
        if ((long)(pIVar8->Temp1).Size <= (long)uVar15) {
LAB_0024632b:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68b,"T &ImVector<double>::operator[](int) [T = double]");
        }
        pdVar2 = (pIVar8->Temp1).Data;
        pdVar2[uVar15] = pdVar2[uVar15] * dVar29;
        uVar15 = uVar15 + 1;
      } while (uVar19 != uVar15);
    }
    scale_max = scale_max * dVar29;
  }
  bVar12 = BeginItem(local_58,-1);
  pIVar9 = GImPlot;
  if (!bVar12) {
    return scale_max;
  }
  if (GImPlot->FitThisFrame != true) goto LAB_00246113;
  pIVar3 = GImPlot->CurrentPlot;
  iVar18 = pIVar3->CurrentYAxis;
  uVar19 = (pIVar3->XAxis).Flags;
  if ((uVar19 >> 10 & 1) == 0) {
    if ((ulong)ABS(local_88) < 0x7ff0000000000000) {
LAB_00245f12:
      if ((0.0 < local_88) || ((uVar19 & 0x20) == 0)) {
        dVar29 = (GImPlot->ExtentsX).Min;
        dVar32 = (GImPlot->ExtentsX).Max;
        uVar16 = -(ulong)(local_88 < dVar29);
        uVar22 = -(ulong)(dVar32 < local_88);
        uVar15 = (ulong)local_88 & uVar22;
        auVar24._0_8_ = ~uVar16 & (ulong)dVar29;
        auVar24._8_8_ = ~uVar22 & (ulong)dVar32;
        auVar7._8_4_ = (int)uVar15;
        auVar7._0_8_ = (ulong)local_88 & uVar16;
        auVar7._12_4_ = (int)(uVar15 >> 0x20);
        GImPlot->ExtentsX = (ImPlotRange)(auVar24 | auVar7);
      }
    }
  }
  else if ((((ulong)ABS(local_88) < 0x7ff0000000000000) &&
           (pIVar3->YAxis[iVar18].Range.Min <= local_98)) &&
          (local_98 <= pIVar3->YAxis[iVar18].Range.Max)) goto LAB_00245f12;
  pIVar17 = pIVar9->ExtentsY + iVar18;
  uVar20 = pIVar3->YAxis[iVar18].Flags;
  if ((uVar20 >> 10 & 1) == 0) {
    if ((ulong)ABS(local_98) < 0x7ff0000000000000) {
LAB_00245fa5:
      if ((0.0 < local_98) || ((uVar20 & 0x20) == 0)) {
        dVar29 = pIVar9->ExtentsY[iVar18].Max;
        uVar16 = -(ulong)(local_98 < pIVar17->Min);
        uVar22 = -(ulong)(dVar29 < local_98);
        uVar15 = (ulong)local_98 & uVar22;
        auVar25._0_8_ = ~uVar16 & (ulong)pIVar17->Min;
        auVar25._8_8_ = ~uVar22 & (ulong)dVar29;
        auVar6._8_4_ = (int)uVar15;
        auVar6._0_8_ = (ulong)local_98 & uVar16;
        auVar6._12_4_ = (int)(uVar15 >> 0x20);
        *pIVar17 = (ImPlotRange)(auVar25 | auVar6);
      }
    }
  }
  else if ((((ulong)ABS(local_98) < 0x7ff0000000000000) && ((pIVar3->XAxis).Range.Min <= local_88))
          && (local_88 <= (pIVar3->XAxis).Range.Max)) goto LAB_00245fa5;
  if ((uVar19 >> 10 & 1) == 0) {
    if ((ulong)ABS(dVar10) < 0x7ff0000000000000) {
LAB_0024602d:
      if (((uVar19 & 0x20) == 0) || (0.0 < dVar10)) {
        dVar29 = (pIVar9->ExtentsX).Min;
        dVar32 = (pIVar9->ExtentsX).Max;
        uVar16 = -(ulong)(dVar10 < dVar29);
        uVar22 = -(ulong)(dVar32 < dVar10);
        uVar15 = (ulong)dVar10 & uVar22;
        auVar26._0_8_ = ~uVar16 & (ulong)dVar29;
        auVar26._8_8_ = ~uVar22 & (ulong)dVar32;
        auVar5._8_4_ = (int)uVar15;
        auVar5._0_8_ = (ulong)dVar10 & uVar16;
        auVar5._12_4_ = (int)(uVar15 >> 0x20);
        pIVar9->ExtentsX = (ImPlotRange)(auVar26 | auVar5);
      }
    }
  }
  else if ((((ulong)ABS(dVar10) < 0x7ff0000000000000) && (pIVar3->YAxis[iVar18].Range.Min <= dVar11)
           ) && (dVar11 <= pIVar3->YAxis[iVar18].Range.Max)) goto LAB_0024602d;
  if ((uVar20 >> 10 & 1) == 0) {
    if (0x7fefffffffffffff < (ulong)ABS(dVar11)) goto LAB_00246113;
  }
  else if (((0x7fefffffffffffff < (ulong)ABS(dVar11)) || (dVar10 < (pIVar3->XAxis).Range.Min)) ||
          ((pIVar3->XAxis).Range.Max < dVar10)) goto LAB_00246113;
  if (((uVar20 & 0x20) == 0) || (0.0 < dVar11)) {
    dVar29 = pIVar9->ExtentsY[iVar18].Max;
    uVar16 = -(ulong)(dVar11 < pIVar17->Min);
    uVar22 = -(ulong)(dVar29 < dVar11);
    uVar15 = (ulong)dVar11 & uVar22;
    auVar27._0_8_ = ~uVar16 & (ulong)pIVar17->Min;
    auVar27._8_8_ = ~uVar22 & (ulong)dVar29;
    auVar4._8_4_ = (int)uVar15;
    auVar4._0_8_ = (ulong)dVar11 & uVar16;
    auVar4._12_4_ = (int)(uVar15 >> 0x20);
    *pIVar17 = (ImPlotRange)(auVar27 | auVar4);
  }
LAB_00246113:
  DrawList = GetPlotDrawList();
  transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
  switch(GImPlot->Scales[transformer.YAxis]) {
  case 0:
    local_40.x = local_88;
    local_40.y = local_98;
    local_50.x = dVar10;
    local_50.y = dVar11;
    RenderHeatmap<double,ImPlot::TransformerLinLin>
              (transformer,DrawList,(pIVar8->Temp1).Data,y_bins,cols,0.0,scale_max,(char *)0x0,
               &local_40,&local_50,false);
    break;
  case 1:
    local_40.x = local_88;
    local_40.y = local_98;
    local_50.x = dVar10;
    local_50.y = dVar11;
    RenderHeatmap<double,ImPlot::TransformerLogLin>
              ((TransformerLogLin)transformer.YAxis,DrawList,(pIVar8->Temp1).Data,y_bins,cols,0.0,
               scale_max,(char *)0x0,&local_40,&local_50,false);
    break;
  case 2:
    local_40.x = local_88;
    local_40.y = local_98;
    local_50.x = dVar10;
    local_50.y = dVar11;
    RenderHeatmap<double,ImPlot::TransformerLinLog>
              ((TransformerLinLog)transformer.YAxis,DrawList,(pIVar8->Temp1).Data,y_bins,cols,0.0,
               scale_max,(char *)0x0,&local_40,&local_50,false);
    break;
  case 3:
    local_40.x = local_88;
    local_40.y = local_98;
    local_50.x = dVar10;
    local_50.y = dVar11;
    RenderHeatmap<double,ImPlot::TransformerLogLog>
              ((TransformerLogLog)transformer.YAxis,DrawList,(pIVar8->Temp1).Data,y_bins,cols,0.0,
               scale_max,(char *)0x0,&local_40,&local_50,false);
  }
  pIVar8 = GImPlot;
  PopPlotClipRect();
  ImPlotNextItemData::Reset(&pIVar8->NextItemData);
  pIVar8->PreviousItem = pIVar8->CurrentItem;
  pIVar8->CurrentItem = (ImPlotItem *)0x0;
  return scale_max;
}

Assistant:

double PlotHistogram2D(const char* label_id, const T* xs, const T* ys, int count, int x_bins, int y_bins, bool density, ImPlotLimits range, bool outliers) {

    if (count <= 0 || x_bins == 0 || y_bins == 0)
        return 0;

    if (range.X.Min == 0 && range.X.Max == 0) {
        T Min, Max;
        ImMinMaxArray(xs, count, &Min, &Max);
        range.X.Min = (double)Min;
        range.X.Max = (double)Max;
    }
    if (range.Y.Min == 0 && range.Y.Max == 0) {
        T Min, Max;
        ImMinMaxArray(ys, count, &Min, &Max);
        range.Y.Min = (double)Min;
        range.Y.Max = (double)Max;
    }

    double width, height;
    if (x_bins < 0)
        CalculateBins(xs, count, x_bins, range.X, x_bins, width);
    else
        width = range.X.Size() / x_bins;
    if (y_bins < 0)
        CalculateBins(ys, count, y_bins, range.Y, y_bins, height);
    else
        height = range.Y.Size() / y_bins;

    const int bins = x_bins * y_bins;

    ImVector<double>& bin_counts = GImPlot->Temp1;
    bin_counts.resize(bins);

    for (int b = 0; b < bins; ++b)
        bin_counts[b] = 0;

    int counted = 0;
    double max_count = 0;
    for (int i = 0; i < count; ++i) {
        if (range.Contains((double)xs[i], (double)ys[i])) {
            const int xb = ImClamp( (int)((double)(xs[i] - range.X.Min) / width)  , 0, x_bins - 1);
            const int yb = ImClamp( (int)((double)(ys[i] - range.Y.Min) / height) , 0, y_bins - 1);
            const int b  = yb * x_bins + xb;
            bin_counts[b] += 1.0;
            if (bin_counts[b] > max_count)
                max_count = bin_counts[b];
            counted++;
        }
    }
    if (density) {
        double scale = 1.0 / ((outliers ? count : counted) * width * height);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count *= scale;
    }

    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(range.Min());
            FitPoint(range.Max());
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
        }
        EndItem();
    }
    return max_count;
}